

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_stepping.cpp
# Opt level: O1

void test_2d_static<1ul,2ul,1ul,30ul>(void)

{
  int line;
  char *expr2;
  int j_1;
  bool *pbVar1;
  int j;
  bool *pbVar2;
  value_type true_idx;
  int dptr [30];
  bool *local_c0;
  bool *local_b8;
  bool *local_b0;
  bool local_a8 [120];
  
  local_a8[0] = true;
  local_b8 = (bool *)CONCAT71(local_b8._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xb7,"void test_2d_static() [N = 1UL, M = 2UL, X = 1UL, Y = 30UL]",local_a8,
             (bool *)&local_b8);
  local_a8[0] = true;
  local_a8[1] = false;
  local_a8[2] = false;
  local_a8[3] = false;
  local_a8[4] = false;
  local_a8[5] = false;
  local_a8[6] = false;
  local_a8[7] = false;
  local_b8._0_4_ = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xb9,"void test_2d_static() [N = 1UL, M = 2UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)local_a8,(int *)&local_b8);
  local_a8[0] = true;
  local_a8[1] = false;
  local_a8[2] = false;
  local_a8[3] = false;
  local_a8[4] = false;
  local_a8[5] = false;
  local_a8[6] = false;
  local_a8[7] = false;
  local_b8 = (bool *)CONCAT44(local_b8._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xba,"void test_2d_static() [N = 1UL, M = 2UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)local_a8,(int *)&local_b8);
  local_a8[0] = true;
  local_a8[1] = false;
  local_a8[2] = false;
  local_a8[3] = false;
  local_a8[4] = false;
  local_a8[5] = false;
  local_a8[6] = false;
  local_a8[7] = false;
  local_b8 = (bool *)0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xbc,"void test_2d_static() [N = 1UL, M = 2UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)local_a8,(unsigned_long *)&local_b8);
  local_a8[0] = true;
  local_a8[1] = false;
  local_a8[2] = false;
  local_a8[3] = false;
  local_a8[4] = false;
  local_a8[5] = false;
  local_a8[6] = false;
  local_a8[7] = false;
  local_b8 = (bool *)0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xbd,"void test_2d_static() [N = 1UL, M = 2UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)local_a8,(unsigned_long *)&local_b8);
  local_a8[0] = true;
  local_b8 = (bool *)CONCAT71(local_b8._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xc3,"void test_2d_static() [N = 1UL, M = 2UL, X = 1UL, Y = 30UL]",local_a8,
             (bool *)&local_b8);
  local_a8[0] = true;
  local_a8[1] = false;
  local_a8[2] = false;
  local_a8[3] = false;
  local_a8[4] = false;
  local_a8[5] = false;
  local_a8[6] = false;
  local_a8[7] = false;
  local_b8 = (bool *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","N",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xc5,"void test_2d_static() [N = 1UL, M = 2UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)local_a8,(unsigned_long *)&local_b8);
  local_a8[0] = true;
  local_a8[1] = false;
  local_a8[2] = false;
  local_a8[3] = false;
  local_a8[4] = false;
  local_a8[5] = false;
  local_a8[6] = false;
  local_a8[7] = false;
  local_b8 = (bool *)0x2;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(1))","M",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xc6,"void test_2d_static() [N = 1UL, M = 2UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)local_a8,(unsigned_long *)&local_b8);
  local_a8[0] = true;
  local_a8[1] = false;
  local_a8[2] = false;
  local_a8[3] = false;
  local_a8[4] = false;
  local_a8[5] = false;
  local_a8[6] = false;
  local_a8[7] = false;
  local_b8 = (bool *)0xf;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","(X / N) * (Y / M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,200,"void test_2d_static() [N = 1UL, M = 2UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)local_a8,(unsigned_long *)&local_b8);
  local_a8[0] = true;
  local_a8[1] = false;
  local_a8[2] = false;
  local_a8[3] = false;
  local_a8[4] = false;
  local_a8[5] = false;
  local_a8[6] = false;
  local_a8[7] = false;
  local_b8 = (bool *)0x1e;
  pbVar1 = local_a8;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xc9,"void test_2d_static() [N = 1UL, M = 2UL, X = 1UL, Y = 30UL]",
             (unsigned_long *)pbVar1,(unsigned_long *)&local_b8);
  pbVar2 = (bool *)0x0;
  do {
    local_c0 = pbVar2;
    local_b8 = pbVar2;
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(l.index(i, j))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
               ,0xd3,"void test_2d_static() [N = 1UL, M = 2UL, X = 1UL, Y = 30UL]",
               (unsigned_long *)&local_c0,(unsigned_long *)&local_b8);
    local_b0 = local_a8 + (long)local_b8 * 4;
    local_c0 = pbVar1;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
               ,0xd5,"void test_2d_static() [N = 1UL, M = 2UL, X = 1UL, Y = 30UL]",(int **)&local_c0
               ,(int **)&local_b0);
    pbVar1[0] = true;
    pbVar1[1] = false;
    pbVar1[2] = false;
    pbVar1[3] = false;
    local_c0 = (bool *)CONCAT44(local_c0._4_4_,0x2a);
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i, j)])","42",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
               ,0xd9,"void test_2d_static() [N = 1UL, M = 2UL, X = 1UL, Y = 30UL]",(int *)pbVar1,
               (int *)&local_c0);
    pbVar2 = pbVar2 + 1;
    pbVar1 = pbVar1 + 4;
  } while (pbVar2 != (bool *)&DAT_0000001e);
  pbVar1 = local_a8;
  pbVar2 = (bool *)0x0;
  do {
    local_c0 = pbVar2;
    local_b8 = pbVar2;
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(sub_l.index(i, j))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
               ,0xe3,"void test_2d_static() [N = 1UL, M = 2UL, X = 1UL, Y = 30UL]",
               (unsigned_long *)&local_c0,(unsigned_long *)&local_b8);
    local_b0 = local_a8 + (long)local_b8 * 4;
    local_c0 = pbVar1;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[sub_l.index(i, j)])","&(dptr[true_idx])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
               ,0xe5,"void test_2d_static() [N = 1UL, M = 2UL, X = 1UL, Y = 30UL]",(int **)&local_c0
               ,(int **)&local_b0);
    pbVar1[0] = true;
    pbVar1[1] = false;
    pbVar1[2] = false;
    pbVar1[3] = false;
    local_c0 = (bool *)CONCAT44(local_c0._4_4_,0x11);
    boost::detail::test_eq_impl<int,int>
              ("(dptr[sub_l.index(i, j)])","17",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
               ,0xe9,"void test_2d_static() [N = 1UL, M = 2UL, X = 1UL, Y = 30UL]",(int *)pbVar1,
               (int *)&local_c0);
    pbVar2 = pbVar2 + 2;
    pbVar1 = pbVar1 + 8;
  } while (pbVar2 != (bool *)&DAT_0000001e);
  pbVar1 = local_a8;
  pbVar2 = (bool *)0x0;
  do {
    local_c0 = pbVar2;
    local_b8 = pbVar2;
    boost::detail::test_eq_impl<unsigned_long,unsigned_long>
              ("(l.index(i, j))","true_idx",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
               ,0xf2,"void test_2d_static() [N = 1UL, M = 2UL, X = 1UL, Y = 30UL]",
               (unsigned_long *)&local_c0,(unsigned_long *)&local_b8);
    if (((ulong)pbVar2 & 1) == 0) {
      local_c0 = (bool *)CONCAT44(local_c0._4_4_,0x11);
      expr2 = "17";
      line = 0xf9;
    }
    else {
      local_c0 = (bool *)CONCAT44(local_c0._4_4_,0x2a);
      expr2 = "42";
      line = 0xfe;
    }
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i, j)])",expr2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
               ,line,"void test_2d_static() [N = 1UL, M = 2UL, X = 1UL, Y = 30UL]",(int *)pbVar1,
               (int *)&local_c0);
    pbVar2 = pbVar2 + 1;
    pbVar1 = pbVar1 + 4;
  } while (pbVar2 != (bool *)&DAT_0000001e);
  return;
}

Assistant:

void test_2d_static()
{ // {{{
    static_assert(0 == (X % N), "X must be divisable by N");
    static_assert(0 == (Y % M), "Y must be divisable by M");

    layout_mapping_right<
        dimensions<X, Y>, dimensions<1, 1>, dimensions<0, 0>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), X * Y);

    layout_mapping_right<
        dimensions<X / N, Y / M>, dimensions<N, M>, dimensions<0, 0> 
    > const sub_l{};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), N);
    BOOST_TEST_EQ((sub_l.stride(1)), M);

    BOOST_TEST_EQ((sub_l.size()), (X / N) * (Y / M));
    BOOST_TEST_EQ((sub_l.span()), X * Y);

    int dptr[X * Y];

    // Set all elements to 42.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx]));

        dptr[l.index(i, j)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
    }

    // Set every (Nth, Mth) element to 17.
    for (auto j = 0; j < sub_l[1]; ++j)
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const s = sub_l.stepping();
        auto const true_idx = (sub_l[1] * s[1]) * (s[0] * i) + (s[1] * j);

        BOOST_TEST_EQ((sub_l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i, j)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i, j)] = 17;

        BOOST_TEST_EQ((dptr[sub_l.index(i, j)]), 17);
    }

    // Check final structure. 
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        // Element in the strided sub-box.
        if (  (0 == (i % sub_l.stepping()[0]))
           && (0 == (j % sub_l.stepping()[1]))
           )
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }
        // Element not in the strided sub-box.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
        }
    }
}